

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QString * __thiscall QFileSystemModelPrivate::name(QFileSystemModelPrivate *this,QModelIndex *index)

{
  bool bVar1;
  QFileSystemNode *this_00;
  pointer this_01;
  QString *in_RSI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *dirNode;
  QString fullPath;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QFileSystemModelPrivate *this_02;
  QModelIndex *in_stack_ffffffffffffffc8;
  QFileSystemModelPrivate *in_stack_ffffffffffffffd0;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  bVar1 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (bVar1) {
    this_00 = node(this_02,(QModelIndex *)in_RDI);
    this_01 = std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::
              operator->((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)
                         0xaa55fe);
    bVar1 = QFileInfoGatherer::resolveSymlinks((QFileInfoGatherer *)this_01);
    if (((!bVar1) ||
        (bVar1 = QHash<QString,_QString>::isEmpty((QHash<QString,_QString> *)&in_RSI[0xc].d.size),
        bVar1)) ||
       (bVar1 = QFileSystemNode::isSymLink
                          ((QFileSystemNode *)in_RDI,(bool)in_stack_ffffffffffffff8f), !bVar1)) {
      QString::QString((QString *)in_RDI,
                       (QString *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    }
    else {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      filePath(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      QDir::fromNativeSeparators((QString *)&local_20);
      QString::~QString((QString *)0xaa568e);
      QHash<QString,_QString>::value((QHash<QString,_QString> *)this_00,in_RSI,(QString *)this_02);
      QString::~QString((QString *)0xaa56b8);
    }
  }
  else {
    QString::QString((QString *)0xaa55d4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_02;
}

Assistant:

QString QFileSystemModelPrivate::name(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
    QFileSystemNode *dirNode = node(index);
    if (
#if QT_CONFIG(filesystemwatcher)
        fileInfoGatherer->resolveSymlinks() &&
#endif
        !resolvedSymLinks.isEmpty() && dirNode->isSymLink(/* ignoreNtfsSymLinks = */ true)) {
        QString fullPath = QDir::fromNativeSeparators(filePath(index));
        return resolvedSymLinks.value(fullPath, dirNode->fileName);
    }
    return dirNode->fileName;
}